

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O1

adt_hkey_t * adt_hnode_find(adt_hnode_t *node,char *key,uint32_t u32Hash)

{
  int iVar1;
  long lVar2;
  adt_hkey_t *paVar3;
  
  for (; node->u8Width == '\x10';
      node = (adt_hnode_t *)
             ((long)&((node->child).match)->u32Hash +
             (ulong)((u32Hash >> ((node->u8Depth & 7) << 2) & 0xf) << 4))) {
  }
  if (node->u8Cur != 0) {
    lVar2 = 0;
    do {
      if (*(uint32_t *)((long)&((node->child).match)->u32Hash + lVar2) == u32Hash) {
        paVar3 = *(adt_hkey_t **)((long)&((node->child).match)->key + lVar2);
        while( true ) {
          if (paVar3 == (adt_hkey_t *)0x0) {
            return (adt_hkey_t *)0x0;
          }
          iVar1 = strcmp(paVar3->key,key);
          if (iVar1 == 0) break;
          paVar3 = paVar3->next;
        }
        return paVar3;
      }
      lVar2 = lVar2 + 0x10;
    } while ((ulong)node->u8Cur * 0x10 != lVar2);
  }
  return (adt_hkey_t *)0x0;
}

Assistant:

adt_hkey_t * adt_hnode_find(const adt_hnode_t *node, const char *key,uint32_t u32Hash){
	if(node->u8Width == 16){
			uint8_t u8Bucket = (uint8_t) ( (u32Hash >> (node->u8Depth*4)) & 0xF);
			return adt_hnode_find(&node->child.node[u8Bucket],key,u32Hash);
	}
	else{
		int i;
		for(i=0;i<node->u8Cur;i++){
			if(node->child.match[i].u32Hash == u32Hash){
				adt_hkey_t *hkey = node->child.match[i].key;
				while( (hkey) && (strcmp(hkey->key,key)!=0) ){
					hkey = hkey->next;
				}
				return hkey;
			}
		}
	}
	return 0;
}